

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *this;
  XercesAttGroupInfo *valueToAdopt;
  XMLStringPool *pXVar3;
  void *pvVar4;
  XSerializeEngine *__nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  ulong uVar5;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  XMLSize_t local_40;
  XMLSize_t local_38;
  
  __nbytes = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&local_38);
    if (*objToLoad ==
        (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this->fMemoryManager = pMVar2;
      this->fAdoptedElems = toAdopt;
      this->fBucketList = (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> **)0x0;
      this->fHashModulus = local_38;
      this->fInitialModulus = local_38;
      this->fCount = 0;
      RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::initialize
                (this,local_38);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,*objToLoad);
    local_40 = 0;
    XSerializeEngine::readSize(serEng,&local_40);
    if (local_40 != 0) {
      uVar5 = 0;
      pvVar4 = extraout_RDX;
      do {
        valueToAdopt = (XercesAttGroupInfo *)
                       XSerializeEngine::read(serEng,0x446b00,pvVar4,(size_t)__nbytes);
        pXVar3 = XSerializeEngine::getStringPool(serEng);
        __nbytes = (XSerializeEngine *)(pXVar3->super_XSerializable)._vptr_XSerializable;
        pvVar4 = (void *)(*(code *)__nbytes->fStorePool)(pXVar3,valueToAdopt->fNameId);
        RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::put
                  (*objToLoad,pvVar4,valueToAdopt);
        uVar5 = uVar5 + 1;
        pvVar4 = extraout_RDX_00;
      } while (uVar5 < local_40);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<XercesAttGroupInfo>** objToLoad
                                   , int
                                   , bool                                 toAdopt
                                   , XSerializeEngine&                    serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<XercesAttGroupInfo>(
                                                                hashModulus
                                                              , toAdopt
                                                              , serEng.getMemoryManager()
                                                              );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            XercesAttGroupInfo*  data;
            serEng>>data;

            XMLCh* key = (XMLCh*) serEng.getStringPool()->getValueForId(data->getNameId());
            (*objToLoad)->put((void*)key, data);
        }
    }
}